

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Parser
XML_ExternalEntityParserCreate(XML_Parser oldParser,XML_Char *context,XML_Char *encodingName)

{
  HASH_TABLE *table;
  STRING_POOL *pool;
  XML_Bool XVar1;
  XML_Char XVar2;
  DTD *pDVar3;
  ELEMENT_TYPE *pEVar4;
  XML_Parser pXVar5;
  XML_Parser pXVar6;
  unsigned_long uVar7;
  DTD *table_00;
  KEY pXVar8;
  XML_StartElementHandler p_Var9;
  XML_EndElementHandler p_Var10;
  XML_CharacterDataHandler p_Var11;
  XML_ProcessingInstructionHandler p_Var12;
  XML_CommentHandler p_Var13;
  XML_StartCdataSectionHandler p_Var14;
  uint uVar15;
  XML_Bool XVar16;
  XML_Parser parser;
  HASH_TABLE *table_01;
  XML_Char *pXVar17;
  NAMED *pNVar18;
  NAMED *pNVar19;
  PREFIX *pPVar20;
  KEY pXVar21;
  NAMED *pNVar22;
  NAMED **ppNVar23;
  XML_Char *pXVar24;
  DTD *in_RCX;
  NAMED **ppNVar25;
  XML_Parser pXVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  XML_Char tmp [2];
  NAMED **local_e8;
  XML_Char *local_d8;
  XML_Char local_ba [2];
  HASH_TABLE *local_b8;
  XML_DefaultHandler p_Stack_b0;
  XML_Char *local_a0;
  XML_EntityDeclHandler local_98;
  XML_XmlDeclHandler p_Stack_90;
  XML_ElementDeclHandler local_88;
  XML_AttlistDeclHandler p_Stack_80;
  XML_SkippedEntityHandler local_78;
  XML_UnknownEncodingHandler p_Stack_70;
  XML_NotStandaloneHandler local_68;
  XML_ExternalEntityRefHandler p_Stack_60;
  XML_StartNamespaceDeclHandler local_58;
  XML_EndNamespaceDeclHandler p_Stack_50;
  XML_UnparsedEntityDeclHandler local_48;
  XML_NotationDeclHandler p_Stack_40;
  
  if (oldParser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  pDVar3 = oldParser->m_dtd;
  p_Var9 = oldParser->m_startElementHandler;
  p_Var10 = oldParser->m_endElementHandler;
  p_Var11 = oldParser->m_characterDataHandler;
  p_Var12 = oldParser->m_processingInstructionHandler;
  p_Var13 = oldParser->m_commentHandler;
  p_Var14 = oldParser->m_startCdataSectionHandler;
  local_b8 = (HASH_TABLE *)oldParser->m_endCdataSectionHandler;
  p_Stack_b0 = oldParser->m_defaultHandler;
  local_48 = oldParser->m_unparsedEntityDeclHandler;
  p_Stack_40 = oldParser->m_notationDeclHandler;
  local_58 = oldParser->m_startNamespaceDeclHandler;
  p_Stack_50 = oldParser->m_endNamespaceDeclHandler;
  local_68 = oldParser->m_notStandaloneHandler;
  p_Stack_60 = oldParser->m_externalEntityRefHandler;
  local_78 = oldParser->m_skippedEntityHandler;
  p_Stack_70 = oldParser->m_unknownEncodingHandler;
  local_88 = oldParser->m_elementDeclHandler;
  p_Stack_80 = oldParser->m_attlistDeclHandler;
  local_98 = oldParser->m_entityDeclHandler;
  p_Stack_90 = oldParser->m_xmlDeclHandler;
  pEVar4 = oldParser->m_declElementType;
  pXVar26 = (XML_Parser)oldParser->m_userData;
  pXVar5 = (XML_Parser)oldParser->m_handlerArg;
  XVar16 = oldParser->m_defaultExpandInternalEntities;
  pXVar6 = oldParser->m_externalEntityRefHandlerArg;
  XVar1 = oldParser->m_ns_triplets;
  uVar7 = oldParser->m_hash_secret_salt;
  if (oldParser->m_ns == '\0') {
    pXVar17 = (XML_Char *)0x0;
  }
  else {
    local_ba[0] = oldParser->m_namespaceSeparator;
    in_RCX = (DTD *)CONCAT71((int7)((ulong)in_RCX >> 8),local_ba[0]);
    pXVar17 = local_ba;
    local_ba[1] = 0;
  }
  local_a0 = context;
  parser = parserCreate(encodingName,&oldParser->m_mem,pXVar17,in_RCX);
  if (parser == (XML_Parser)0x0) {
    return (XML_Parser)0x0;
  }
  parser->m_startElementHandler = p_Var9;
  parser->m_endElementHandler = p_Var10;
  parser->m_characterDataHandler = p_Var11;
  parser->m_processingInstructionHandler = p_Var12;
  parser->m_commentHandler = p_Var13;
  parser->m_startCdataSectionHandler = p_Var14;
  parser->m_endCdataSectionHandler = (XML_EndCdataSectionHandler)local_b8;
  parser->m_defaultHandler = p_Stack_b0;
  parser->m_unparsedEntityDeclHandler = local_48;
  parser->m_notationDeclHandler = p_Stack_40;
  parser->m_startNamespaceDeclHandler = local_58;
  parser->m_endNamespaceDeclHandler = p_Stack_50;
  parser->m_notStandaloneHandler = local_68;
  parser->m_externalEntityRefHandler = p_Stack_60;
  parser->m_skippedEntityHandler = local_78;
  parser->m_unknownEncodingHandler = p_Stack_70;
  parser->m_elementDeclHandler = local_88;
  parser->m_attlistDeclHandler = p_Stack_80;
  parser->m_entityDeclHandler = local_98;
  parser->m_xmlDeclHandler = p_Stack_90;
  parser->m_declElementType = pEVar4;
  parser->m_userData = pXVar26;
  if (pXVar26 != pXVar5) {
    pXVar26 = parser;
  }
  parser->m_handlerArg = pXVar26;
  if (pXVar6 != oldParser) {
    parser->m_externalEntityRefHandlerArg = pXVar6;
  }
  parser->m_defaultExpandInternalEntities = XVar16;
  parser->m_ns_triplets = XVar1;
  parser->m_hash_secret_salt = uVar7;
  parser->m_parentParser = oldParser;
  table_00 = parser->m_dtd;
  ppNVar25 = (pDVar3->prefixes).v;
  if (ppNVar25 == (NAMED **)0x0) {
    ppNVar23 = (NAMED **)0x0;
  }
  else {
    ppNVar23 = ppNVar25 + (pDVar3->prefixes).size;
  }
  pool = &table_00->pool;
  table_01 = &table_00->prefixes;
  do {
    if (ppNVar25 == ppNVar23) {
      ppNVar25 = (pDVar3->attributeIds).v;
      if (ppNVar25 == (NAMED **)0x0) {
        ppNVar23 = (NAMED **)0x0;
      }
      else {
        ppNVar23 = ppNVar25 + (pDVar3->attributeIds).size;
      }
      table = &table_00->attributeIds;
      goto LAB_005e6605;
    }
    pNVar18 = *ppNVar25;
    ppNVar25 = ppNVar25 + 1;
  } while ((pNVar18 == (NAMED *)0x0) ||
          ((pXVar17 = poolCopyString(pool,pNVar18->name), pXVar17 != (XML_Char *)0x0 &&
           (pNVar18 = lookup(oldParser,table_01,pXVar17,0x10), pNVar18 != (NAMED *)0x0))));
  goto LAB_005e65a0;
LAB_005e6605:
  if (ppNVar25 != ppNVar23) {
    pNVar18 = *ppNVar25;
    ppNVar25 = ppNVar25 + 1;
    if (pNVar18 != (NAMED *)0x0) {
      pXVar17 = (table_00->pool).ptr;
      if (pXVar17 == (table_00->pool).end) {
        XVar16 = poolGrow(pool);
        if (XVar16 == '\0') goto LAB_005e65a0;
        pXVar17 = (table_00->pool).ptr;
      }
      (table_00->pool).ptr = pXVar17 + 1;
      *pXVar17 = '\0';
      pXVar17 = poolCopyString(pool,pNVar18->name);
      if ((pXVar17 == (XML_Char *)0x0) ||
         (pNVar19 = lookup(oldParser,table,pXVar17 + 1,0x18), pNVar19 == (NAMED *)0x0))
      goto LAB_005e65a0;
      *(undefined1 *)&pNVar19[2].name = *(undefined1 *)&pNVar18[2].name;
      pXVar21 = pNVar18[1].name;
      if (pXVar21 != (KEY)0x0) {
        *(undefined1 *)((long)&pNVar19[2].name + 1) = *(undefined1 *)((long)&pNVar18[2].name + 1);
        pPVar20 = &table_00->defaultPrefix;
        if ((PREFIX *)pXVar21 != &pDVar3->defaultPrefix) {
          pPVar20 = (PREFIX *)lookup(oldParser,table_01,*(KEY *)pXVar21,0);
        }
        pNVar19[1].name = (KEY)pPVar20;
      }
    }
    goto LAB_005e6605;
  }
  ppNVar25 = (pDVar3->elementTypes).v;
  if (ppNVar25 == (NAMED **)0x0) {
    local_e8 = (NAMED **)0x0;
  }
  else {
    local_e8 = ppNVar25 + (pDVar3->elementTypes).size;
  }
  local_b8 = &table_00->elementTypes;
  while (ppNVar25 != local_e8) {
    pNVar18 = *ppNVar25;
    ppNVar25 = ppNVar25 + 1;
    if (pNVar18 != (NAMED *)0x0) {
      pXVar17 = poolCopyString(pool,pNVar18->name);
      if ((pXVar17 == (XML_Char *)0x0) ||
         (pNVar19 = lookup(oldParser,local_b8,pXVar17,0x28), pNVar19 == (NAMED *)0x0))
      goto LAB_005e65a0;
      if ((long)*(int *)&pNVar18[3].name != 0) {
        pXVar21 = (KEY)(*(parser->m_mem).malloc_fcn)((long)*(int *)&pNVar18[3].name * 0x18);
        pNVar19[4].name = pXVar21;
        if (pXVar21 == (KEY)0x0) goto LAB_005e65a0;
      }
      if (pNVar18[2].name != (KEY)0x0) {
        pNVar22 = lookup(oldParser,table,*(KEY *)pNVar18[2].name,0);
        pNVar19[2].name = (KEY)pNVar22;
      }
      iVar28 = *(int *)&pNVar18[3].name;
      *(int *)&pNVar19[3].name = iVar28;
      *(int *)((long)&pNVar19[3].name + 4) = iVar28;
      if (pNVar18[1].name != (KEY)0x0) {
        pNVar22 = lookup(oldParser,table_01,*(KEY *)pNVar18[1].name,0);
        pNVar19[1].name = (KEY)pNVar22;
        iVar28 = *(int *)&pNVar19[3].name;
      }
      if (0 < iVar28) {
        lVar27 = 0;
        lVar29 = 0;
        do {
          pNVar22 = lookup(oldParser,table,(KEY)**(undefined8 **)(pNVar18[4].name + lVar27),0);
          pXVar21 = pNVar19[4].name;
          *(NAMED **)(pXVar21 + lVar27) = pNVar22;
          pXVar8 = pNVar18[4].name;
          pXVar21[lVar27 + 8] = pXVar8[lVar27 + 8];
          pXVar17 = *(XML_Char **)(pXVar8 + lVar27 + 0x10);
          if (pXVar17 == (XML_Char *)0x0) {
            pXVar21 = pXVar21 + lVar27 + 0x10;
            pXVar21[0] = '\0';
            pXVar21[1] = '\0';
            pXVar21[2] = '\0';
            pXVar21[3] = '\0';
            pXVar21[4] = '\0';
            pXVar21[5] = '\0';
            pXVar21[6] = '\0';
            pXVar21[7] = '\0';
          }
          else {
            pXVar17 = poolCopyString(pool,pXVar17);
            *(XML_Char **)(pNVar19[4].name + lVar27 + 0x10) = pXVar17;
            if (pXVar17 == (XML_Char *)0x0) goto LAB_005e65a0;
          }
          lVar29 = lVar29 + 1;
          lVar27 = lVar27 + 0x18;
        } while (lVar29 < *(int *)&pNVar19[3].name);
      }
    }
  }
  ppNVar25 = (pDVar3->generalEntities).v;
  if (ppNVar25 == (NAMED **)0x0) {
    ppNVar23 = (NAMED **)0x0;
  }
  else {
    ppNVar23 = ppNVar25 + (pDVar3->generalEntities).size;
  }
  local_e8 = (NAMED **)0x0;
  local_d8 = (XML_Char *)0x0;
  while (ppNVar25 != ppNVar23) {
    pNVar18 = *ppNVar25;
    ppNVar25 = ppNVar25 + 1;
    if (pNVar18 != (NAMED *)0x0) {
      pXVar17 = poolCopyString(pool,pNVar18->name);
      if ((pXVar17 == (XML_Char *)0x0) ||
         (pNVar19 = lookup(oldParser,&table_00->generalEntities,pXVar17,0x40),
         pNVar19 == (NAMED *)0x0)) goto LAB_005e65a0;
      if (pNVar18[3].name == (XML_Char *)0x0) {
        pXVar17 = pNVar18[1].name;
        iVar28 = *(int *)&pNVar18[2].name;
        if (((table_00->pool).ptr == (XML_Char *)0x0) && (XVar16 = poolGrow(pool), XVar16 == '\0'))
        goto LAB_005e65a0;
        if (0 < iVar28) {
          iVar28 = iVar28 + 1;
          do {
            pXVar24 = (table_00->pool).ptr;
            if (pXVar24 == (table_00->pool).end) {
              XVar16 = poolGrow(pool);
              if (XVar16 == '\0') goto LAB_005e65a0;
              pXVar24 = (table_00->pool).ptr;
            }
            XVar2 = *pXVar17;
            (table_00->pool).ptr = pXVar24 + 1;
            *pXVar24 = XVar2;
            pXVar17 = pXVar17 + 1;
            iVar28 = iVar28 + -1;
          } while (1 < iVar28);
        }
        pXVar17 = (table_00->pool).start;
        (table_00->pool).start = (table_00->pool).ptr;
        if (pXVar17 == (XML_Char *)0x0) goto LAB_005e65a0;
        pNVar19[1].name = pXVar17;
        *(undefined4 *)&pNVar19[2].name = *(undefined4 *)&pNVar18[2].name;
      }
      else {
        pXVar17 = poolCopyString(pool,pNVar18[3].name);
        if (pXVar17 == (XML_Char *)0x0) goto LAB_005e65a0;
        pNVar19[3].name = pXVar17;
        pXVar17 = pNVar18[4].name;
        if (pXVar17 != (XML_Char *)0x0) {
          if ((pXVar17 != local_d8) &&
             (local_e8 = (NAMED **)poolCopyString(pool,pXVar17), local_d8 = pXVar17,
             local_e8 == (NAMED **)0x0)) goto LAB_005e65a0;
          pNVar19[4].name = (KEY)local_e8;
        }
        if (pNVar18[5].name != (XML_Char *)0x0) {
          pXVar17 = poolCopyString(pool,pNVar18[5].name);
          if (pXVar17 == (XML_Char *)0x0) goto LAB_005e65a0;
          pNVar19[5].name = pXVar17;
        }
      }
      if (pNVar18[6].name != (XML_Char *)0x0) {
        pXVar17 = poolCopyString(pool,pNVar18[6].name);
        if (pXVar17 == (XML_Char *)0x0) goto LAB_005e65a0;
        pNVar19[6].name = pXVar17;
      }
      *(undefined1 *)((long)&pNVar19[7].name + 1) = *(undefined1 *)((long)&pNVar18[7].name + 1);
      *(undefined1 *)((long)&pNVar19[7].name + 2) = *(undefined1 *)((long)&pNVar18[7].name + 2);
    }
  }
  table_00->keepProcessing = pDVar3->keepProcessing;
  table_00->hasParamEntityRefs = pDVar3->hasParamEntityRefs;
  table_00->standalone = pDVar3->standalone;
  table_00->in_eldecl = pDVar3->in_eldecl;
  table_00->scaffold = pDVar3->scaffold;
  uVar15 = pDVar3->scaffSize;
  table_00->contentStringLen = pDVar3->contentStringLen;
  table_00->scaffSize = uVar15;
  table_00->scaffLevel = pDVar3->scaffLevel;
  table_00->scaffIndex = pDVar3->scaffIndex;
  XVar16 = setContext(parser,local_a0);
  if (XVar16 != '\0') {
    parser->m_processor = externalEntityInitProcessor;
    return parser;
  }
LAB_005e65a0:
  XML_ParserFree(parser);
  return (XML_Parser)0x0;
}

Assistant:

XML_Parser XMLCALL
XML_ExternalEntityParserCreate(XML_Parser oldParser, const XML_Char *context,
                               const XML_Char *encodingName) {
  XML_Parser parser = oldParser;
  DTD *newDtd = NULL;
  DTD *oldDtd;
  XML_StartElementHandler oldStartElementHandler;
  XML_EndElementHandler oldEndElementHandler;
  XML_CharacterDataHandler oldCharacterDataHandler;
  XML_ProcessingInstructionHandler oldProcessingInstructionHandler;
  XML_CommentHandler oldCommentHandler;
  XML_StartCdataSectionHandler oldStartCdataSectionHandler;
  XML_EndCdataSectionHandler oldEndCdataSectionHandler;
  XML_DefaultHandler oldDefaultHandler;
  XML_UnparsedEntityDeclHandler oldUnparsedEntityDeclHandler;
  XML_NotationDeclHandler oldNotationDeclHandler;
  XML_StartNamespaceDeclHandler oldStartNamespaceDeclHandler;
  XML_EndNamespaceDeclHandler oldEndNamespaceDeclHandler;
  XML_NotStandaloneHandler oldNotStandaloneHandler;
  XML_ExternalEntityRefHandler oldExternalEntityRefHandler;
  XML_SkippedEntityHandler oldSkippedEntityHandler;
  XML_UnknownEncodingHandler oldUnknownEncodingHandler;
  XML_ElementDeclHandler oldElementDeclHandler;
  XML_AttlistDeclHandler oldAttlistDeclHandler;
  XML_EntityDeclHandler oldEntityDeclHandler;
  XML_XmlDeclHandler oldXmlDeclHandler;
  ELEMENT_TYPE *oldDeclElementType;

  void *oldUserData;
  void *oldHandlerArg;
  XML_Bool oldDefaultExpandInternalEntities;
  XML_Parser oldExternalEntityRefHandlerArg;
#ifdef XML_DTD
  enum XML_ParamEntityParsing oldParamEntityParsing;
  int oldInEntityValue;
#endif
  XML_Bool oldns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  unsigned long oldhash_secret_salt;

  /* Validate the oldParser parameter before we pull everything out of it */
  if (oldParser == NULL)
    return NULL;

  /* Stash the original parser contents on the stack */
  oldDtd = parser->m_dtd;
  oldStartElementHandler = parser->m_startElementHandler;
  oldEndElementHandler = parser->m_endElementHandler;
  oldCharacterDataHandler = parser->m_characterDataHandler;
  oldProcessingInstructionHandler = parser->m_processingInstructionHandler;
  oldCommentHandler = parser->m_commentHandler;
  oldStartCdataSectionHandler = parser->m_startCdataSectionHandler;
  oldEndCdataSectionHandler = parser->m_endCdataSectionHandler;
  oldDefaultHandler = parser->m_defaultHandler;
  oldUnparsedEntityDeclHandler = parser->m_unparsedEntityDeclHandler;
  oldNotationDeclHandler = parser->m_notationDeclHandler;
  oldStartNamespaceDeclHandler = parser->m_startNamespaceDeclHandler;
  oldEndNamespaceDeclHandler = parser->m_endNamespaceDeclHandler;
  oldNotStandaloneHandler = parser->m_notStandaloneHandler;
  oldExternalEntityRefHandler = parser->m_externalEntityRefHandler;
  oldSkippedEntityHandler = parser->m_skippedEntityHandler;
  oldUnknownEncodingHandler = parser->m_unknownEncodingHandler;
  oldElementDeclHandler = parser->m_elementDeclHandler;
  oldAttlistDeclHandler = parser->m_attlistDeclHandler;
  oldEntityDeclHandler = parser->m_entityDeclHandler;
  oldXmlDeclHandler = parser->m_xmlDeclHandler;
  oldDeclElementType = parser->m_declElementType;

  oldUserData = parser->m_userData;
  oldHandlerArg = parser->m_handlerArg;
  oldDefaultExpandInternalEntities = parser->m_defaultExpandInternalEntities;
  oldExternalEntityRefHandlerArg = parser->m_externalEntityRefHandlerArg;
#ifdef XML_DTD
  oldParamEntityParsing = parser->m_paramEntityParsing;
  oldInEntityValue = parser->m_prologState.inEntityValue;
#endif
  oldns_triplets = parser->m_ns_triplets;
  /* Note that the new parser shares the same hash secret as the old
     parser, so that dtdCopy and copyEntityTable can lookup values
     from hash tables associated with either parser without us having
     to worry which hash secrets each table has.
  */
  oldhash_secret_salt = parser->m_hash_secret_salt;

#ifdef XML_DTD
  if (! context)
    newDtd = oldDtd;
#endif /* XML_DTD */

  /* Note that the magical uses of the pre-processor to make field
     access look more like C++ require that `parser' be overwritten
     here.  This makes this function more painful to follow than it
     would be otherwise.
  */
  if (parser->m_ns) {
    XML_Char tmp[2] = {parser->m_namespaceSeparator, 0};
    parser = parserCreate(encodingName, &parser->m_mem, tmp, newDtd);
  } else {
    parser = parserCreate(encodingName, &parser->m_mem, NULL, newDtd);
  }

  if (! parser)
    return NULL;

  parser->m_startElementHandler = oldStartElementHandler;
  parser->m_endElementHandler = oldEndElementHandler;
  parser->m_characterDataHandler = oldCharacterDataHandler;
  parser->m_processingInstructionHandler = oldProcessingInstructionHandler;
  parser->m_commentHandler = oldCommentHandler;
  parser->m_startCdataSectionHandler = oldStartCdataSectionHandler;
  parser->m_endCdataSectionHandler = oldEndCdataSectionHandler;
  parser->m_defaultHandler = oldDefaultHandler;
  parser->m_unparsedEntityDeclHandler = oldUnparsedEntityDeclHandler;
  parser->m_notationDeclHandler = oldNotationDeclHandler;
  parser->m_startNamespaceDeclHandler = oldStartNamespaceDeclHandler;
  parser->m_endNamespaceDeclHandler = oldEndNamespaceDeclHandler;
  parser->m_notStandaloneHandler = oldNotStandaloneHandler;
  parser->m_externalEntityRefHandler = oldExternalEntityRefHandler;
  parser->m_skippedEntityHandler = oldSkippedEntityHandler;
  parser->m_unknownEncodingHandler = oldUnknownEncodingHandler;
  parser->m_elementDeclHandler = oldElementDeclHandler;
  parser->m_attlistDeclHandler = oldAttlistDeclHandler;
  parser->m_entityDeclHandler = oldEntityDeclHandler;
  parser->m_xmlDeclHandler = oldXmlDeclHandler;
  parser->m_declElementType = oldDeclElementType;
  parser->m_userData = oldUserData;
  if (oldUserData == oldHandlerArg)
    parser->m_handlerArg = parser->m_userData;
  else
    parser->m_handlerArg = parser;
  if (oldExternalEntityRefHandlerArg != oldParser)
    parser->m_externalEntityRefHandlerArg = oldExternalEntityRefHandlerArg;
  parser->m_defaultExpandInternalEntities = oldDefaultExpandInternalEntities;
  parser->m_ns_triplets = oldns_triplets;
  parser->m_hash_secret_salt = oldhash_secret_salt;
  parser->m_parentParser = oldParser;
#ifdef XML_DTD
  parser->m_paramEntityParsing = oldParamEntityParsing;
  parser->m_prologState.inEntityValue = oldInEntityValue;
  if (context) {
#endif /* XML_DTD */
    if (! dtdCopy(oldParser, parser->m_dtd, oldDtd, &parser->m_mem)
        || ! setContext(parser, context)) {
      XML_ParserFree(parser);
      return NULL;
    }
    parser->m_processor = externalEntityInitProcessor;
#ifdef XML_DTD
  } else {
    /* The DTD instance referenced by parser->m_dtd is shared between the
       document's root parser and external PE parsers, therefore one does not
       need to call setContext. In addition, one also *must* not call
       setContext, because this would overwrite existing prefix->binding
       pointers in parser->m_dtd with ones that get destroyed with the external
       PE parser. This would leave those prefixes with dangling pointers.
    */
    parser->m_isParamEntity = XML_TRUE;
    XmlPrologStateInitExternalEntity(&parser->m_prologState);
    parser->m_processor = externalParEntInitProcessor;
  }
#endif /* XML_DTD */
  return parser;
}